

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

void __thiscall QRegularExpressionMatch::QRegularExpressionMatch(QRegularExpressionMatch *this)

{
  QRegularExpressionMatchPrivate *pQVar1;
  long in_FS_OFFSET;
  QRegularExpression local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QRegularExpressionMatchPrivate *)operator_new(0x60);
  QRegularExpression::QRegularExpression(&local_30);
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  QRegularExpression::QRegularExpression(&pQVar1->regularExpression,&local_30);
  (pQVar1->subjectStorage).d.size = 0;
  (pQVar1->subject).m_size = 0;
  (pQVar1->subjectStorage).d.d = (Data *)0x0;
  (pQVar1->subjectStorage).d.ptr = (char16_t *)0x0;
  (pQVar1->subject).m_data = (storage_type_conflict *)0x0;
  pQVar1->matchType = NoMatch;
  *(undefined8 *)&pQVar1->matchOptions = 0;
  *(undefined8 *)((long)&(pQVar1->capturedOffsets).d.d + 4) = 0;
  *(undefined8 *)((long)&(pQVar1->capturedOffsets).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(pQVar1->capturedOffsets).d.size + 4) = 0;
  *(undefined4 *)((long)&pQVar1->capturedCount + 3) = 0;
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  QRegularExpression::~QRegularExpression(&local_30);
  ((this->d).d.ptr)->isValid = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch::QRegularExpressionMatch()
    : d(new QRegularExpressionMatchPrivate(QRegularExpression(),
                                           QString(),
                                           QStringView(),
                                           QRegularExpression::NoMatch,
                                           QRegularExpression::NoMatchOption))
{
    d->isValid = true;
}